

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O2

bool __thiscall BoardView::AnyItemVisible(BoardView *this)

{
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  pointer psVar2;
  bool bVar3;
  bool bVar4;
  shared_ptr<Pin> *p_1;
  pointer psVar5;
  shared_ptr<Component> *p;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *__r;
  long local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  long local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  if (this->m_searchComponents == true) {
    p_Var1 = &((this->m_partHighlighted).
               super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)->
              super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>;
    bVar4 = false;
    for (__r = &((this->m_partHighlighted).
                 super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
                super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>; __r != p_Var1;
        __r = __r + 1) {
      std::__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Component,void>
                ((__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2> *)&local_40,__r);
      if (local_40 == 0) {
        bVar3 = true;
      }
      else {
        bVar3 = *(int *)(local_40 + 8) == 2 || *(int *)(local_40 + 8) == this->m_current_side;
      }
      bVar4 = (bool)(bVar4 | bVar3);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    }
    if (bVar4) {
      return bVar4;
    }
  }
  else {
    bVar4 = false;
  }
  if (this->m_searchNets == true) {
    psVar2 = (this->m_pinHighlighted).
             super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (psVar5 = (this->m_pinHighlighted).
                  super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
                  _M_impl.super__Vector_impl_data._M_start; psVar5 != psVar2; psVar5 = psVar5 + 1) {
      std::__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Component,void>
                ((__shared_ptr<BoardElement,(__gnu_cxx::_Lock_policy)2> *)&local_50,
                 &(((psVar5->super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->component
                  ).super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>);
      if (local_50 == 0) {
        bVar3 = true;
      }
      else {
        bVar3 = *(int *)(local_50 + 8) == 2 || *(int *)(local_50 + 8) == this->m_current_side;
      }
      bVar4 = (bool)(bVar4 | bVar3);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_48);
    }
  }
  return bVar4;
}

Assistant:

bool BoardView::AnyItemVisible(void) {
	bool any_visible = false;

	if (m_searchComponents) {
		for (auto &p : m_partHighlighted) {
			any_visible |= BoardElementIsVisible(p);
		}
	}

	if (!any_visible) {
		if (m_searchNets) {
			for (auto &p : m_pinHighlighted) {
				any_visible |= BoardElementIsVisible(p->component);
			}
		}
	}

	return any_visible;
}